

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Facet.hpp
# Opt level: O3

bool __thiscall
Parfait::Facet::triBoxOverlap
          (Facet *this,Point<double> *boxcenter,Point<double> *boxhalfsize,
          array<Parfait::Point<double>,_3UL> *triverts)

{
  bool bVar1;
  long lVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  Point<double> local_d0;
  double local_b8;
  double dStack_b0;
  double local_a8;
  double dStack_a0;
  double local_98;
  double dStack_90;
  double local_88;
  undefined8 uStack_80;
  double local_70 [4];
  double dStack_50;
  double local_48;
  double dStack_40;
  double local_38 [4];
  Point<double> local_18;
  
  local_70[2] = (boxcenter->pos)._M_elems[2];
  local_88 = triverts->_M_elems[0].pos._M_elems[2] - local_70[2];
  local_d0.pos._M_elems[2] = local_88;
  local_48 = (boxcenter->pos)._M_elems[0];
  local_70[1] = (boxcenter->pos)._M_elems[1];
  local_d0.pos._M_elems[0] = triverts->_M_elems[0].pos._M_elems[0] - local_48;
  dStack_40 = triverts->_M_elems[1].pos._M_elems[0] - local_48;
  local_d0.pos._M_elems[1] = triverts->_M_elems[0].pos._M_elems[1] - local_70[1];
  local_48 = triverts->_M_elems[2].pos._M_elems[0] - local_48;
  local_38[1] = triverts->_M_elems[1].pos._M_elems[1] - local_70[1];
  local_38[0] = dStack_40;
  local_38[2] = triverts->_M_elems[1].pos._M_elems[2] - local_70[2];
  local_70[2] = triverts->_M_elems[2].pos._M_elems[2] - local_70[2];
  local_70[1] = triverts->_M_elems[2].pos._M_elems[1] - local_70[1];
  local_70[0] = local_48;
  local_a8 = local_48 - dStack_40;
  dStack_a0 = local_38[1] - local_d0.pos._M_elems[1];
  dVar6 = local_38[2] - local_88;
  dVar8 = local_70[2] - local_38[2];
  uStack_80 = 0;
  dVar7 = dVar6 * local_d0.pos._M_elems[1] - dStack_a0 * local_88;
  dVar9 = dVar6 * local_70[1] - dStack_a0 * local_70[2];
  dVar3 = dVar7;
  if (dVar9 <= dVar7) {
    dVar3 = dVar9;
  }
  dVar5 = (boxhalfsize->pos)._M_elems[2];
  dVar12 = (boxhalfsize->pos)._M_elems[1];
  dVar10 = ABS(dVar6) * dVar12 + ABS(dStack_a0) * dVar5;
  bVar1 = false;
  if (dVar3 + -1e-10 <= dVar10) {
    if (dVar9 <= dVar7) {
      dVar9 = dVar7;
    }
    if (-dVar10 <= dVar9 + 1e-10) {
      local_b8 = dStack_40 - local_d0.pos._M_elems[0];
      dStack_b0 = local_70[1] - local_38[1];
      dVar7 = local_88 * local_b8 - dVar6 * local_d0.pos._M_elems[0];
      dVar3 = local_70[2] * local_b8 - dVar6 * local_48;
      dVar9 = dVar7;
      if (dVar3 <= dVar7) {
        dVar9 = dVar3;
      }
      dVar10 = (boxhalfsize->pos)._M_elems[0];
      dVar4 = ABS(dVar6) * dVar10 + ABS(local_b8) * dVar5;
      bVar1 = false;
      if (dVar9 + -1e-10 <= dVar4) {
        if (dVar3 <= dVar7) {
          dVar3 = dVar7;
        }
        bVar1 = false;
        if (-dVar4 <= dVar3 + 1e-10) {
          dVar7 = dStack_a0 * local_48 - local_b8 * local_70[1];
          dVar9 = dStack_a0 * dStack_40 - local_b8 * local_38[1];
          dVar3 = dVar7;
          if (dVar9 <= dVar7) {
            dVar3 = dVar9;
          }
          dVar4 = ABS(dStack_a0) * dVar10 + ABS(local_b8) * dVar12;
          bVar1 = false;
          if (dVar3 + -1e-10 <= dVar4) {
            if (dVar9 <= dVar7) {
              dVar9 = dVar7;
            }
            if (-dVar4 <= dVar9 + 1e-10) {
              local_70[3] = -local_88;
              dStack_50 = -local_70[2];
              dVar7 = local_d0.pos._M_elems[1] * dVar8 + dStack_b0 * local_70[3];
              dVar9 = local_70[1] * dVar8 + dStack_b0 * dStack_50;
              dVar3 = dVar7;
              if (dVar9 <= dVar7) {
                dVar3 = dVar9;
              }
              dVar4 = ABS(dVar8) * dVar12 + ABS(dStack_b0) * dVar5;
              bVar1 = false;
              if (dVar3 + -1e-10 <= dVar4) {
                if (dVar9 <= dVar7) {
                  dVar9 = dVar7;
                }
                if (-dVar4 <= dVar9 + 1e-10) {
                  dVar7 = local_88 * local_a8 - dVar8 * local_d0.pos._M_elems[0];
                  dVar9 = local_70[2] * local_a8 - dVar8 * local_48;
                  dVar3 = dVar7;
                  if (dVar9 <= dVar7) {
                    dVar3 = dVar9;
                  }
                  dVar4 = ABS(dVar8) * dVar10 + ABS(local_a8) * dVar5;
                  bVar1 = false;
                  if (dVar3 + -1e-10 <= dVar4) {
                    if (dVar9 <= dVar7) {
                      dVar9 = dVar7;
                    }
                    if (-dVar4 <= dVar9 + 1e-10) {
                      dVar7 = dStack_40 * dStack_b0 + local_a8 * -local_38[1];
                      dVar3 = local_d0.pos._M_elems[0] * dStack_b0 +
                              local_a8 * -local_d0.pos._M_elems[1];
                      dVar9 = dVar7;
                      if (dVar3 <= dVar7) {
                        dVar9 = dVar3;
                      }
                      dVar4 = ABS(dStack_b0) * dVar10 + ABS(local_a8) * dVar12;
                      bVar1 = false;
                      if (dVar9 + -1e-10 <= dVar4) {
                        if (dVar3 <= dVar7) {
                          dVar3 = dVar7;
                        }
                        if (-dVar4 <= dVar3 + 1e-10) {
                          dVar4 = local_d0.pos._M_elems[1] - local_70[1];
                          dVar11 = local_88 - local_70[2];
                          dVar7 = local_d0.pos._M_elems[1] * dVar11 + local_70[3] * dVar4;
                          dVar3 = local_38[1] * dVar11 + -local_38[2] * dVar4;
                          dVar9 = dVar7;
                          if (dVar3 <= dVar7) {
                            dVar9 = dVar3;
                          }
                          dVar13 = ABS(dVar11) * dVar12 + ABS(dVar4) * dVar5;
                          bVar1 = false;
                          if (dVar9 + -1e-10 <= dVar13) {
                            if (dVar3 <= dVar7) {
                              dVar3 = dVar7;
                            }
                            if (-dVar13 <= dVar3 + 1e-10) {
                              dVar13 = local_d0.pos._M_elems[0] - local_48;
                              dVar7 = local_88 * dVar13 - dVar11 * local_d0.pos._M_elems[0];
                              dVar9 = local_38[2] * dVar13 - dStack_40 * dVar11;
                              dVar3 = dVar7;
                              if (dVar9 <= dVar7) {
                                dVar3 = dVar9;
                              }
                              dVar5 = ABS(dVar11) * dVar10 + dVar5 * ABS(dVar13);
                              bVar1 = false;
                              if (dVar3 + -1e-10 <= dVar5) {
                                if (dVar9 <= dVar7) {
                                  dVar9 = dVar7;
                                }
                                if (-dVar5 <= dVar9 + 1e-10) {
                                  dVar7 = dVar4 * local_48 + dVar13 * -local_70[1];
                                  dVar3 = dVar4 * dStack_40 + dVar13 * -local_38[1];
                                  dVar9 = dVar7;
                                  if (dVar3 <= dVar7) {
                                    dVar9 = dVar3;
                                  }
                                  dVar5 = ABS(dVar4) * dVar10 + ABS(dVar13) * dVar12;
                                  bVar1 = false;
                                  if (dVar9 + -1e-10 <= dVar5) {
                                    if (dVar3 <= dVar7) {
                                      dVar3 = dVar7;
                                    }
                                    if (-dVar5 <= dVar3 + 1e-10) {
                                      lVar2 = 0;
                                      do {
                                        dVar3 = local_d0.pos._M_elems[lVar2];
                                        dVar9 = local_38[lVar2];
                                        dVar7 = local_70[lVar2];
                                        dVar5 = dVar9;
                                        if (dVar3 <= dVar9) {
                                          dVar5 = dVar3;
                                        }
                                        dVar12 = dVar7;
                                        if (dVar5 <= dVar7) {
                                          dVar12 = dVar5;
                                        }
                                        dVar5 = (boxhalfsize->pos)._M_elems[lVar2];
                                        if (dVar5 < dVar12 + -1e-10) {
                                          return false;
                                        }
                                        if (dVar9 <= dVar3) {
                                          dVar9 = dVar3;
                                        }
                                        if (dVar7 <= dVar9) {
                                          dVar7 = dVar9;
                                        }
                                        if (dVar7 + 1e-10 < -dVar5) {
                                          return false;
                                        }
                                        lVar2 = lVar2 + 1;
                                      } while (lVar2 != 3);
                                      local_18.pos._M_elems[2] =
                                           dStack_b0 * local_b8 - dStack_a0 * local_a8;
                                      local_18.pos._M_elems[1] = local_a8 * dVar6 - dVar8 * local_b8
                                      ;
                                      local_18.pos._M_elems[0] =
                                           dStack_a0 * dVar8 - dVar6 * dStack_b0;
                                      local_98 = dStack_a0;
                                      dStack_90 = dStack_a0;
                                      bVar1 = planeBoxOverlap(&local_18,&local_d0,boxhalfsize);
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return bVar1;
}

Assistant:

inline bool Parfait::Facet::triBoxOverlap(
    const Parfait::Point<double>& boxcenter,
    const Parfait::Point<double>& boxhalfsize,
    const std::array<Parfait::Point<double>,3>& triverts) const {

    auto v0 = triverts[0] - boxcenter;
    auto v1 = triverts[1] - boxcenter;
    auto v2 = triverts[2] - boxcenter;

    auto e0 = v1 - v0;
    auto e1 = v2 - v1;
    auto e2 = v0 - v2;

    auto fex = fabs(e0[0]);
    auto fey = fabs(e0[1]);
    auto fez = fabs(e0[2]);
    if(AXISTEST_X(e0[2], e0[1], fez, fey, v0, v2, boxhalfsize)) return false;
    if(AXISTEST_Y(e0[2], e0[0], fez, fex, v0, v2, boxhalfsize)) return false;
    if(AXISTEST_Z(e0[1], e0[0], fey, fex, v1, v2, boxhalfsize)) return false;

    fex = fabs(e1[0]);
    fey = fabs(e1[1]);
    fez = fabs(e1[2]);
    if(AXISTEST_X(e1[2], e1[1], fez, fey, v0, v2, boxhalfsize)) return false;
    if(AXISTEST_Y(e1[2], e1[0], fez, fex, v0, v2, boxhalfsize)) return false;
    if(AXISTEST_Z(e1[1], e1[0], fey, fex, v0, v1, boxhalfsize)) return false;

    fex = fabs(e2[0]);
    fey = fabs(e2[1]);
    fez = fabs(e2[2]);
    if(AXISTEST_X(e2[2], e2[1], fez, fey, v0, v1, boxhalfsize)) return false;
    if(AXISTEST_Y(e2[2], e2[0], fez, fex, v0, v1, boxhalfsize)) return false;
    if(AXISTEST_Z(e2[1], e2[0], fey, fex, v1, v2, boxhalfsize)) return false;

    for(int i = 0; i < 3; i++) {
        double min, max;
        std::tie(min, max) = findMinMax(v0[i], v1[i], v2[i]);
        if (min - TOL > boxhalfsize[i] || max + TOL < -boxhalfsize[i]) return false;
    }
    auto normal = Parfait::Point<double>::cross(e0, e1);
    return planeBoxOverlap(normal, v0, boxhalfsize);
}